

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  string_view message_00;
  bool bVar1;
  undefined4 error_code_00;
  int iVar2;
  size_t sVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> this;
  char **in_R8;
  undefined1 auStack_260 [4];
  int result;
  char *system_message;
  allocator<char> local_241;
  undefined1 local_240 [8];
  memory_buffer buf;
  int error_code_local;
  buffer<char> *out_local;
  string_view message_local;
  
  message_local.data_ = (char *)message.size_;
  out_local = (buffer<char> *)message.data_;
  buf._532_4_ = error_code;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_240,&local_241);
  std::allocator<char>::~allocator(&local_241);
  detail::buffer<char>::resize((buffer<char> *)local_240,500);
  do {
    _auStack_260 = detail::buffer<char>::operator[]<int>((buffer<char> *)local_240,0);
    error_code_00 = buf._532_4_;
    sVar3 = detail::buffer<char>::size((buffer<char> *)local_240);
    iVar2 = detail::safe_strerror(error_code_00,(char **)auStack_260,sVar3);
    if (iVar2 == 0) {
      this = std::back_inserter<fmt::v7::detail::buffer<char>>(out);
      format_to<fmt::v7::detail::buffer<char>,_char[7],_fmt::v7::basic_string_view<char>_&,_char_*&,_0>
                ((v7 *)this.container,(back_insert_iterator<fmt::v7::detail::buffer<char>_>)0x1583fd
                 ,(char (*) [7])&out_local,(basic_string_view<char> *)auStack_260,in_R8);
      bVar1 = true;
LAB_00123476:
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_240);
      if (!bVar1) {
        message_00.size_ = (size_t)message_local.data_;
        message_00.data_ = (char *)out_local;
        detail::format_error_code(out,buf._532_4_,message_00);
      }
      return;
    }
    if (iVar2 != 0x22) {
      bVar1 = false;
      goto LAB_00123476;
    }
    sVar3 = detail::buffer<char>::size((buffer<char> *)local_240);
    detail::buffer<char>::resize((buffer<char> *)local_240,sVar3 * 2);
  } while( true );
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(std::back_inserter(out), "{}: {}", message, system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }